

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

void t_xtra_act(keypress ch,wchar_t oid)

{
  undefined *puVar1;
  
  if (ch._0_8_ >> 0x20 == 0x54) {
    if (LIGHTING_DARK < t_uik_lighting) {
      t_uik_lighting = LIGHTING_LIT;
      return;
    }
    puVar1 = &DAT_002414a0;
  }
  else {
    if (ch.code != 0x74) {
      return;
    }
    if (LIGHTING_LIT < t_uik_lighting) {
      t_uik_lighting = LIGHTING_LIT;
      return;
    }
    puVar1 = &DAT_00240464;
  }
  t_uik_lighting = *(grid_light_level *)(puVar1 + (ulong)t_uik_lighting * 4);
  return;
}

Assistant:

static void t_xtra_act(struct keypress ch, int oid)
{
	/* XXX must be a better way to cycle this */
	if (ch.code == 't') {
		switch (t_uik_lighting) {
				case LIGHTING_LIT:  t_uik_lighting = LIGHTING_TORCH; break;
                case LIGHTING_TORCH: t_uik_lighting = LIGHTING_LOS; break;
				case LIGHTING_LOS:  t_uik_lighting = LIGHTING_DARK; break;
				default:	t_uik_lighting = LIGHTING_LIT; break;
		}		
	} else if (ch.code == 'T') {
		switch (t_uik_lighting) {
				case LIGHTING_DARK:  t_uik_lighting = LIGHTING_LOS; break;
                case LIGHTING_LOS: t_uik_lighting = LIGHTING_TORCH; break;
				case LIGHTING_LIT:  t_uik_lighting = LIGHTING_DARK; break;
				default:	t_uik_lighting = LIGHTING_LIT; break;
		}
	}
	
}